

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Ptr_t * Abc_AigDfsMap(Abc_Ntk_t *pNtk)

{
  undefined4 uVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  void *pvVar5;
  int *piVar6;
  Vec_Ptr_t *vNodes;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  int Fill;
  int Fill_00;
  int iVar10;
  int iVar11;
  long lVar12;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x4db,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar10 = pNtk->vObjs->nSize;
    uVar9 = (long)iVar10 + 500;
    iVar11 = (int)uVar9;
    if ((pNtk->vTravIds).nCap < iVar11) {
      piVar6 = (int *)malloc(uVar9 * 4);
      (pNtk->vTravIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar11;
    }
    if (-500 < iVar10) {
      memset((pNtk->vTravIds).pArray,0,(uVar9 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar11;
  }
  iVar10 = pNtk->nTravIds;
  pNtk->nTravIds = iVar10 + 1;
  if (0x3ffffffe < iVar10) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  vNodes->pArray = ppvVar7;
  pVVar8 = pNtk->vCos;
  uVar9 = (ulong)(uint)pVVar8->nSize;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      if ((long)(int)uVar9 - (long)pNtk->nBarBufs <= lVar12) {
        plVar3 = (long *)pVVar8->pArray[lVar12];
        Abc_AigDfs_rec(*(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8),
                       vNodes);
        lVar4 = *plVar3;
        uVar1 = *(undefined4 *)(lVar4 + 0xd8);
        iVar10 = (int)plVar3[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar10 + 1,Fill);
        if (((long)iVar10 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar10)) goto LAB_001c4f22;
        *(undefined4 *)(*(long *)(lVar4 + 0xe8) + (long)iVar10 * 4) = uVar1;
        pvVar5 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
        if ((*(uint *)((long)pvVar5 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(Abc_ObjFanout0(pNode))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                        ,0x4e8,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
        }
        uVar2 = vNodes->nCap;
        if (vNodes->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(vNodes->pArray,0x80);
            }
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar2 * 2;
            if (iVar10 <= (int)uVar2) goto LAB_001c4e2a;
            if (vNodes->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
            }
          }
          vNodes->pArray = ppvVar7;
          vNodes->nCap = iVar10;
        }
LAB_001c4e2a:
        iVar10 = vNodes->nSize;
        vNodes->nSize = iVar10 + 1;
        vNodes->pArray[iVar10] = pvVar5;
      }
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vCos;
      uVar9 = (ulong)pVVar8->nSize;
    } while (lVar12 < (long)uVar9);
  }
  pVVar8 = pNtk->vCos;
  uVar9 = (ulong)(uint)pVVar8->nSize;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      if ((long)(int)uVar9 - (long)pNtk->nBarBufs <= lVar12) {
        return vNodes;
      }
      plVar3 = (long *)pVVar8->pArray[lVar12];
      Abc_AigDfs_rec(*(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8),
                     vNodes);
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) - 5 < 0xfffffffe) {
        __assert_fail("Abc_ObjIsCo(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                      ,0x4f1,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
      }
      lVar4 = *plVar3;
      uVar1 = *(undefined4 *)(lVar4 + 0xd8);
      iVar10 = (int)plVar3[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar10 + 1,Fill_00);
      if (((long)iVar10 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar10)) {
LAB_001c4f22:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar4 + 0xe8) + (long)iVar10 * 4) = uVar1;
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vCos;
      uVar9 = (ulong)pVVar8->nSize;
    } while (lVar12 < (long)uVar9);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_AigDfsMap( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // collect cones of barbufs
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i < Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            continue;
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        Abc_NodeSetTravIdCurrent( pNode );
        // collect latch as a placeholder
        assert( Abc_ObjIsLatch(Abc_ObjFanout0(pNode)) );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(pNode) );
    }
    // collect nodes of real POs
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i >= Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        assert( Abc_ObjIsCo(pNode) );
        Abc_NodeSetTravIdCurrent( pNode );
    }
    return vNodes;
}